

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

Am_Object __thiscall Am_Object::Get_Object(Am_Object *this,Am_Slot_Key key,Am_Slot_Flags flags)

{
  Am_Value *in_value;
  ulong in_RCX;
  undefined6 in_register_00000032;
  
  in_value = Get((Am_Object *)CONCAT62(in_register_00000032,key),(Am_Slot_Key)flags,in_RCX | 2);
  if (in_value->type == 0xa001) {
    Am_Object(this,in_value);
  }
  else {
    if ((in_value->value).wrapper_value != (Am_Wrapper *)0x0) {
      slot_error("Slot does not contain a value of type Object",
                 (Am_Object *)CONCAT62(in_register_00000032,key),(Am_Slot_Key)flags);
    }
    Am_Object(this,&Am_No_Object);
  }
  return (Am_Object)(Am_Object_Data *)this;
}

Assistant:

Am_Object
Am_Object::Get_Object(Am_Slot_Key key, Am_Slot_Flags flags) const
{
  const Am_Value &v = Get(key, flags | Am_RETURN_ZERO_ON_ERROR_BIT);

  if (v.type == Am_OBJECT)
    return v;
  else if (v.value.wrapper_value == nullptr)
    return Am_No_Object;
  else
    slot_error("Slot does not contain a value of type Object", *this, key);
  return Am_No_Object; //should never get here
}